

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeStiffnessMatrix(ChElementTetraCorot_4 *this)

{
  ChMatrixNM<double,_4,_4> *dst;
  ulong uVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ChLog *this_00;
  ChStreamOutAscii *pCVar5;
  ulong uVar6;
  char *__function;
  double *pdVar7;
  int unVal;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  bool bVar12;
  double *pdVar13;
  ulong uVar14;
  int unVal_00;
  ActualDstType actualDst;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [64];
  ChMatrixNM<double,_4,_4> tmp;
  assign_op<double,_double> local_161;
  undefined1 local_160 [4];
  undefined1 auStack_15c [4];
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_158;
  long local_118 [3];
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  lVar4 = 0;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar4 * 4) = *(undefined8 *)(&local_158.m_lhs.m_lhs.field_0x0 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  lVar4 = 2;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar4 * 4) = *(undefined8 *)(auStack_15c + lVar4 + 2);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x1a);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  lVar4 = 4;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar4 * 4) = *(undefined8 *)(auStack_15c + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x1c);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  lVar4 = 6;
  do {
    *(undefined8 *)
     ((long)local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array + lVar4 * 4) = *(undefined8 *)(local_160 + lVar4 + 2);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x1e);
  local_158.m_lhs.m_lhs._0_8_ = &local_100;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xc]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xf]
       = 1.0;
  dst = &this->mM;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,(SrcXprType *)&local_158,(assign_op<double,_double> *)local_118);
  uVar1 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows;
  uVar6 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols;
  lVar4 = uVar6 * uVar1;
  if (0 < lVar4) {
    pdVar7 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data;
    *pdVar7 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[0];
    if (((((((((3 < lVar4) &&
              (pdVar7[3] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[4], 6 < lVar4)) &&
             (pdVar7[6] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[8], 9 < lVar4)) &&
            ((pdVar7[9] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[0xc], 0xd < lVar4 &&
             (pdVar7[0xd] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[1], 0x10 < lVar4)))) &&
           ((pdVar7[0x10] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[5], 0x13 < lVar4 &&
            ((pdVar7[0x13] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                             .m_storage.m_data.array[9], 0x16 < lVar4 &&
             (pdVar7[0x16] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                             .m_storage.m_data.array[0xd], 0x1a < lVar4)))))) &&
          (pdVar7[0x1a] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[2], 0x1d < lVar4)) &&
         ((((pdVar7[0x1d] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[6], 0x20 < lVar4 &&
            (pdVar7[0x20] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[10], 0x23 < lVar4)) &&
           (pdVar7[0x23] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0xe], lVar4 != 0x24)) &&
          (((pdVar7[0x24] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[1], 0x25 < lVar4 &&
            (pdVar7[0x25] = (dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).
                            m_storage.m_data.array[0], 0x27 < lVar4)) &&
           ((pdVar7[0x27] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[5], lVar4 != 0x28 &&
            ((pdVar7[0x28] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                             .m_storage.m_data.array[4], 0x2a < lVar4 &&
             (pdVar7[0x2a] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                             .m_storage.m_data.array[9], lVar4 != 0x2b)))))))))) &&
        ((pdVar7[0x2b] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[8], 0x2d < lVar4 &&
         (((pdVar7[0x2d] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0xd], lVar4 != 0x2e &&
           (pdVar7[0x2e] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0xc], 0x31 < lVar4)) &&
          (pdVar7[0x31] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[2], lVar4 != 0x32)))))) &&
       ((((pdVar7[0x32] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[1], 0x34 < lVar4 &&
          (pdVar7[0x34] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[6], lVar4 != 0x35)) &&
         (((pdVar7[0x35] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[5], 0x37 < lVar4 &&
           ((pdVar7[0x37] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[10], lVar4 != 0x38 &&
            (pdVar7[0x38] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[9], 0x3a < lVar4)))) &&
          (pdVar7[0x3a] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[0xe], lVar4 != 0x3b)))) &&
        (((((pdVar7[0x3b] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[0xd], 0x3c < lVar4 &&
            (pdVar7[0x3c] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[2], 0x3e < lVar4)) &&
           (pdVar7[0x3e] = (dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).
                           m_storage.m_data.array[0], lVar4 != 0x3f)) &&
          ((pdVar7[0x3f] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[6], 0x41 < lVar4 &&
           (pdVar7[0x41] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[4], lVar4 != 0x42)))) &&
         ((pdVar7[0x42] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                          m_storage.m_data.array[10], 0x44 < lVar4 &&
          ((pdVar7[0x44] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[8], lVar4 != 0x45 &&
           (pdVar7[0x45] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0xe], 0x47 < lVar4)))))))))) {
      pdVar7[0x47] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xc];
      if ((long)(uVar6 | uVar1) < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
      peVar2 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (uVar1 == (peVar2->StressStrainMatrix).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
         ) {
        local_158.m_lhs.m_lhs.m_rhs.m_matrix = &this->MatrB;
        local_158.m_lhs.m_rhs = &peVar2->StressStrainMatrix;
        local_158.m_lhs.m_lhs.m_lhs.m_functor.m_other = this->Volume;
        local_158.m_lhs.m_lhs.m_lhs.m_rows.m_value = uVar6;
        local_158.m_lhs.m_lhs.m_lhs.m_cols.m_value = uVar1;
        local_158.m_rhs = local_158.m_lhs.m_lhs.m_rhs.m_matrix;
        if ((peVar2->StressStrainMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols ==
            uVar1) {
          Eigen::Matrix<double,-1,-1,1,-1,-1>::
          Matrix<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                    ((Matrix<double,_1,_1,1,_1,_1> *)local_118,&local_158);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                    (&this->StiffnessMatrix,(Matrix<double,__1,__1,_1,__1,__1> *)local_118,
                     &local_161);
          if (local_118[0] != 0) {
            free(*(void **)(local_118[0] + -8));
          }
          uVar1 = (this->StiffnessMatrix).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
          uVar6 = 1;
          if (1 < (long)uVar1) {
            uVar6 = uVar1;
          }
          if (uVar6 != 1) {
            uVar15 = (this->StiffnessMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_cols;
            lVar4 = 0;
            lVar10 = 0;
            uVar8 = uVar15;
            uVar9 = uVar1;
            do {
              lVar10 = lVar10 + 1;
              if (lVar10 < (long)uVar15) {
                pdVar7 = (this->StiffnessMatrix).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_data;
                uVar16 = 1;
                uVar14 = uVar15;
                do {
                  if (uVar9 == uVar16) goto LAB_006b155a;
                  *(undefined8 *)((long)pdVar7 + uVar16 * 8 + lVar4) =
                       *(undefined8 *)((long)pdVar7 + uVar14 * 8 + lVar4);
                  uVar16 = uVar16 + 1;
                  uVar14 = uVar14 + uVar15;
                } while (uVar8 != uVar16);
              }
              uVar9 = uVar9 - 1;
              lVar4 = lVar4 + uVar15 * 8 + 8;
              uVar8 = uVar8 - 1;
            } while (lVar10 != uVar6 - 1);
          }
          if ((long)uVar1 < 1) {
            unVal_00 = -1;
            _local_160 = 0.0;
            unVal = -1;
          }
          else {
            pdVar7 = (this->StiffnessMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_data;
            uVar6 = (this->StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols;
            auVar20 = ZEXT1664(ZEXT816(0));
            uVar8 = 0xffffffff;
            bVar12 = true;
            uVar9 = 0;
            auVar17._8_8_ = 0x7fffffffffffffff;
            auVar17._0_8_ = 0x7fffffffffffffff;
            uVar15 = 0xffffffff;
            pdVar11 = pdVar7;
            do {
              if (0 < (long)uVar6) {
                if ((!bVar12) || ((long)uVar6 <= (long)uVar9)) {
LAB_006b155a:
                  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                               );
                }
                uVar14 = 0;
                pdVar13 = pdVar11;
                do {
                  if (uVar1 <= uVar6 - 1) goto LAB_006b155a;
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = pdVar7[uVar14] - *pdVar13;
                  auVar18 = vandpd_avx(auVar18,auVar17);
                  dVar19 = auVar20._0_8_;
                  auVar3 = vmaxsd_avx(auVar18,auVar20._0_16_);
                  auVar20 = ZEXT1664(auVar3);
                  if (dVar19 < auVar18._0_8_) {
                    uVar15 = uVar9 & 0xffffffff;
                    uVar8 = uVar14 & 0xffffffff;
                  }
                  uVar14 = uVar14 + 1;
                  pdVar13 = pdVar13 + uVar6;
                } while (uVar6 != uVar14);
              }
              unVal_00 = (int)uVar15;
              unVal = (int)uVar8;
              _local_160 = auVar20._0_8_;
              uVar9 = uVar9 + 1;
              bVar12 = (long)uVar9 < (long)uVar1;
              pdVar11 = pdVar11 + 1;
              pdVar7 = pdVar7 + uVar6;
            } while (uVar9 != uVar1);
          }
          if (1e-10 < _local_160) {
            this_00 = GetLog();
            pCVar5 = ChStreamOutAscii::operator<<
                               (&this_00->super_ChStreamOutAscii,
                                "NONSYMMETRIC local stiffness matrix! err ");
            pCVar5 = ChStreamOutAscii::operator<<(pCVar5,_local_160);
            pCVar5 = ChStreamOutAscii::operator<<(pCVar5," at ");
            pCVar5 = ChStreamOutAscii::operator<<(pCVar5,unVal_00);
            pCVar5 = ChStreamOutAscii::operator<<(pCVar5,",");
            pCVar5 = ChStreamOutAscii::operator<<(pCVar5,unVal);
            ChStreamOutAscii::operator<<(pCVar5,"\n");
          }
          return;
        }
        __function = 
        "Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
        ;
      }
      else {
        __function = 
        "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
        ;
      }
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_4::ComputeStiffnessMatrix() {
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetX0().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetX0().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetX0().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetX0().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    ////MatrB.Reset(6, 12);
    MatrB(0) = mM(0);
    MatrB(3) = mM(4);
    MatrB(6) = mM(8);
    MatrB(9) = mM(12);
    MatrB(13) = mM(1);
    MatrB(16) = mM(5);
    MatrB(19) = mM(9);
    MatrB(22) = mM(13);
    MatrB(26) = mM(2);
    MatrB(29) = mM(6);
    MatrB(32) = mM(10);
    MatrB(35) = mM(14);
    MatrB(36) = mM(1);
    MatrB(37) = mM(0);
    MatrB(39) = mM(5);
    MatrB(40) = mM(4);
    MatrB(42) = mM(9);
    MatrB(43) = mM(8);
    MatrB(45) = mM(13);
    MatrB(46) = mM(12);
    MatrB(49) = mM(2);
    MatrB(50) = mM(1);
    MatrB(52) = mM(6);
    MatrB(53) = mM(5);
    MatrB(55) = mM(10);
    MatrB(56) = mM(9);
    MatrB(58) = mM(14);
    MatrB(59) = mM(13);
    MatrB(60) = mM(2);
    MatrB(62) = mM(0);
    MatrB(63) = mM(6);
    MatrB(65) = mM(4);
    MatrB(66) = mM(10);
    MatrB(68) = mM(8);
    MatrB(69) = mM(14);
    MatrB(71) = mM(12);

    StiffnessMatrix = Volume * MatrB.transpose() * Material->Get_StressStrainMatrix() * MatrB;

    // ***TEST*** SYMMETRIZE TO AVOID ROUNDOFF ASYMMETRY
    for (int row = 0; row < StiffnessMatrix.rows() - 1; ++row)
        for (int col = row + 1; col < StiffnessMatrix.cols(); ++col)
            StiffnessMatrix(row, col) = StiffnessMatrix(col, row);

    double max_err = 0;
    int err_r = -1;
    int err_c = -1;
    for (int row = 0; row < StiffnessMatrix.rows(); ++row)
        for (int col = 0; col < StiffnessMatrix.cols(); ++col) {
            double diff = fabs(StiffnessMatrix(row, col) - StiffnessMatrix(col, row));
            if (diff > max_err) {
                max_err = diff;
                err_r = row;
                err_c = col;
            }
        }
    if (max_err > 1e-10)
        GetLog() << "NONSYMMETRIC local stiffness matrix! err " << max_err << " at " << err_r << "," << err_c << "\n";
}